

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O1

void __thiscall
spvtools::disassemble::InstructionDisassembler::InstructionDisassembler
          (InstructionDisassembler *this,AssemblyGrammar *grammar,ostream *stream,uint32_t options,
          NameMapper *name_mapper)

{
  undefined8 uVar1;
  
  this->grammar_ = grammar;
  this->stream_ = stream;
  this->print_ = (bool)((byte)(options >> 1) & 1);
  this->color_ = (bool)((byte)options >> 2 & 1);
  this->indent_ = (int)(options << 0x1c) >> 0x1f & 0xf;
  this->nested_indent_ = (bool)((byte)(options >> 8) & 1);
  this->comment_ = options >> 7 & 1;
  this->show_byte_offset_ = (bool)((byte)options >> 4 & 1);
  *(undefined8 *)&(this->name_mapper_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->name_mapper_).super__Function_base._M_functor + 8) = 0;
  (this->name_mapper_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->name_mapper_)._M_invoker = name_mapper->_M_invoker;
  if ((name_mapper->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(name_mapper->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->name_mapper_).super__Function_base._M_functor =
         *(undefined8 *)&(name_mapper->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->name_mapper_).super__Function_base._M_functor + 8) = uVar1;
    (this->name_mapper_).super__Function_base._M_manager =
         (name_mapper->super__Function_base)._M_manager;
    (name_mapper->super__Function_base)._M_manager = (_Manager_type)0x0;
    name_mapper->_M_invoker = (_Invoker_type)0x0;
  }
  (this->id_comments_)._M_h._M_buckets = &(this->id_comments_)._M_h._M_single_bucket;
  (this->id_comments_)._M_h._M_bucket_count = 1;
  (this->id_comments_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_comments_)._M_h._M_element_count = 0;
  (this->id_comments_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_comments_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_comments_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->last_instruction_comment_alignment_ = 0;
  return;
}

Assistant:

InstructionDisassembler::InstructionDisassembler(const AssemblyGrammar& grammar,
                                                 std::ostream& stream,
                                                 uint32_t options,
                                                 NameMapper name_mapper)
    : grammar_(grammar),
      stream_(stream),
      print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
      color_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_COLOR, options)),
      indent_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_INDENT, options)
                  ? kStandardIndent
                  : 0),
      nested_indent_(
          spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
      comment_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_COMMENT, options)),
      show_byte_offset_(
          spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_SHOW_BYTE_OFFSET, options)),
      name_mapper_(std::move(name_mapper)),
      last_instruction_comment_alignment_(0) {}